

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::(anonymous_namespace)::
FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
::AllocateStrings<std::__cxx11::string&>
          (FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in)

{
  initializer_list<google::protobuf::(anonymous_namespace)::ExpressionEater> iVar1;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string local_60 [39];
  ExpressionEater local_39;
  iterator local_38;
  undefined8 local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  string *res;
  string *strings;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_local;
  FlatAllocatorImpl<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::SourceCodeInfo,_google::protobuf::FileDescriptorTables,_google::protobuf::FeatureSet,_google::protobuf::MessageOptions,_google::protobuf::FieldOptions,_google::protobuf::EnumOptions,_google::protobuf::EnumValueOptions,_google::protobuf::ExtensionRangeOptions,_google::protobuf::OneofOptions,_google::protobuf::ServiceOptions,_google::protobuf::MethodOptions,_google::protobuf::FileOptions>
  *this_local;
  
  strings = in;
  in_local = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  local_28 = AllocateArray<std::__cxx11::string>(this,1);
  res = local_28;
  std::__cxx11::string::string(local_60,(string *)strings);
  this_00 = res;
  res = res + 1;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::__cxx11::string::operator=((string *)this_00,local_60);
  ExpressionEater::ExpressionEater<std::__cxx11::string&>(&local_39,pbVar2);
  local_38 = (iterator)&local_39;
  local_30 = 1;
  iVar1._M_len = 1;
  iVar1._M_array = local_38;
  anon_unknown_24::Fold(iVar1);
  std::__cxx11::string::~string(local_60);
  return local_28;
}

Assistant:

const std::string* AllocateStrings(In&&... in) {
    std::string* strings = AllocateArray<std::string>(sizeof...(in));
    std::string* res = strings;
    Fold({(*strings++ = std::string(std::forward<In>(in)))...});
    return res;
  }